

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

OASIS_FLOAT ** __thiscall
summarycalc::alloc_ssl_arrays(summarycalc *this,int summary_set,int sample_size)

{
  OASIS_FLOAT **ppOVar1;
  OASIS_FLOAT *pOVar2;
  long lVar3;
  ulong uVar4;
  int i;
  long lVar5;
  
  if (this->min_summary_id_[summary_set] == 1) {
    lVar5 = (long)this->max_summary_id_[summary_set];
    uVar4 = lVar5 * 8 + 8;
    if (lVar5 < -1) {
      uVar4 = 0xffffffffffffffff;
    }
    ppOVar1 = (OASIS_FLOAT **)operator_new__(uVar4);
    lVar3 = (long)sample_size + (long)this->num_idx_;
    uVar4 = lVar3 * 4 + 4;
    if ((int)lVar3 < -1) {
      uVar4 = 0xffffffffffffffff;
    }
    for (lVar3 = 0; lVar3 <= lVar5; lVar3 = lVar3 + 1) {
      pOVar2 = (OASIS_FLOAT *)operator_new__(uVar4);
      ppOVar1[lVar3] = pOVar2;
    }
    return ppOVar1;
  }
  fwrite("FATAL: summarycalc: Minimum summary ID is not equal to one\n",0x3b,1,_stderr);
  exit(-1);
}

Assistant:

OASIS_FLOAT **summarycalc::alloc_ssl_arrays(int summary_set, int sample_size)
{
	if (min_summary_id_[summary_set] != 1) {
		fprintf(stderr, "FATAL: summarycalc: Minimum summary ID is not equal to one\n");
		exit(-1);
	}
	int maxsummaryids = max_summary_id_[summary_set] ;
	OASIS_FLOAT **ssl = new OASIS_FLOAT*[maxsummaryids + 1];
	for (int i = 0; i <= maxsummaryids; i++){
		ssl[i] = new OASIS_FLOAT[sample_size + num_idx_ + 1];   // allocate for -5, -4, -3, -2, -1, 0 as well as samplesize
	}
	return ssl;
}